

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::VectorDCE::RewriteInstructions
          (VectorDCE *this,Function *function,LiveComponentMap *live_components)

{
  undefined1 uVar1;
  undefined8 *puVar2;
  _func_void *p_Var3;
  undefined8 *puVar4;
  bool modified;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> dead_dbg_value
  ;
  __alloc_node_gen_t __alloc_node_gen_1;
  __alloc_node_gen_t __alloc_node_gen;
  undefined1 local_c9;
  undefined8 *local_c8;
  undefined8 *puStack_c0;
  long local_b8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>_>_>
  local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  undefined1 *local_80;
  VectorDCE *pVStack_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_70;
  undefined8 **local_38;
  
  local_80 = &local_c9;
  local_c9 = 0;
  local_b8 = 0;
  local_c8 = (undefined8 *)0x0;
  puStack_c0 = (undefined8 *)0x0;
  local_70._M_buckets = (__buckets_ptr)0x0;
  local_70._M_bucket_count = (live_components->_M_h)._M_bucket_count;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = (live_components->_M_h)._M_element_count;
  local_70._M_rehash_policy._0_8_ = *(undefined8 *)&(live_components->_M_h)._M_rehash_policy;
  local_70._M_rehash_policy._M_next_resize = (live_components->_M_h)._M_rehash_policy._M_next_resize
  ;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_unused._0_8_ = (undefined8)&local_70;
  pVStack_78 = this;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,spvtools::utils::BitVector>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_70,&live_components->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_false>_>_>
              *)&local_a0);
  local_a0._8_8_ = 0;
  local_38 = &local_c8;
  p_Var3 = (_func_void *)operator_new(0x50);
  *(undefined1 **)p_Var3 = local_80;
  *(VectorDCE **)(p_Var3 + 8) = pVStack_78;
  local_a8._M_h = (__hashtable_alloc *)(p_Var3 + 0x10);
  *(long *)(p_Var3 + 0x10) = 0;
  *(size_type *)(p_Var3 + 0x18) = local_70._M_bucket_count;
  *(long *)(p_Var3 + 0x20) = 0;
  *(size_type *)(p_Var3 + 0x28) = local_70._M_element_count;
  *(undefined8 *)(p_Var3 + 0x30) = local_70._M_rehash_policy._0_8_;
  *(size_t *)(p_Var3 + 0x38) = local_70._M_rehash_policy._M_next_resize;
  *(long *)(p_Var3 + 0x40) = 0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,spvtools::utils::BitVector>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_a8._M_h,&local_70,&local_a8);
  *(undefined8 ***)(p_Var3 + 0x48) = local_38;
  local_88 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:321:25)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp:321:25)>
             ::_M_manager;
  local_a0._M_unused._0_8_ = (undefined8)p_Var3;
  opt::Function::ForEachInst
            (function,(function<void_(spvtools::opt::Instruction_*)> *)&local_a0,false,false);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::utils::BitVector>,_std::allocator<std::pair<const_unsigned_int,_spvtools::utils::BitVector>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_70);
  puVar2 = puStack_c0;
  uVar1 = local_c9;
  for (puVar4 = local_c8; local_c9 = uVar1, puVar4 != puVar2; puVar4 = puVar4 + 1) {
    IRContext::KillInst((this->super_MemPass).super_Pass.context_,(Instruction *)*puVar4);
    uVar1 = local_c9;
  }
  if (local_c8 != (undefined8 *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  return (bool)uVar1;
}

Assistant:

bool VectorDCE::RewriteInstructions(
    Function* function, const VectorDCE::LiveComponentMap& live_components) {
  bool modified = false;

  // Kill DebugValue in the middle of the instruction iteration will result
  // in accessing a dangling pointer. We keep dead DebugValue instructions
  // in |dead_dbg_value| to kill them once after the iteration.
  std::vector<Instruction*> dead_dbg_value;

  function->ForEachInst([&modified, this, live_components,
                         &dead_dbg_value](Instruction* current_inst) {
    if (!context()->IsCombinatorInstruction(current_inst)) {
      return;
    }

    auto live_component = live_components.find(current_inst->result_id());
    if (live_component == live_components.end()) {
      // If this instruction is not in live_components then it does not
      // produce a vector, or it is never referenced and ADCE will remove
      // it.  No point in trying to differentiate.
      return;
    }

    // If no element in the current instruction is used replace it with an
    // OpUndef.
    if (live_component->second.Empty()) {
      modified = true;
      MarkDebugValueUsesAsDead(current_inst, &dead_dbg_value);
      uint32_t undef_id = this->Type2Undef(current_inst->type_id());
      context()->KillNamesAndDecorates(current_inst);
      context()->ReplaceAllUsesWith(current_inst->result_id(), undef_id);
      context()->KillInst(current_inst);
      return;
    }

    switch (current_inst->opcode()) {
      case spv::Op::OpCompositeInsert:
        modified |= RewriteInsertInstruction(
            current_inst, live_component->second, &dead_dbg_value);
        break;
      case spv::Op::OpCompositeConstruct:
        // TODO: The members that are not live can be replaced by an undef
        // or constant. This will remove uses of those values, and possibly
        // create opportunities for ADCE.
        break;
      default:
        // Do nothing.
        break;
    }
  });
  for (auto* i : dead_dbg_value) context()->KillInst(i);
  return modified;
}